

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stopwatch.hpp
# Opt level: O2

uint64_t __thiscall Stopwatch::getElapsedNanosec(Stopwatch *this)

{
  long lVar1;
  uint64_t uVar2;
  
  uVar2 = this->elapsed;
  if (this->isRunning == true) {
    lVar1 = std::chrono::_V2::system_clock::now();
    uVar2 = (lVar1 + uVar2) - (this->startMark).__d.__r;
  }
  return uVar2;
}

Assistant:

uint64_t getElapsedNanosec() const {
		uint64_t elns = elapsed;
		if (isRunning) {
			chrono_t endMark = std::chrono::high_resolution_clock::now();
			uint64_t ns = std::chrono::duration_cast<sw_unit>(endMark - startMark).count();
			elns += ns;
		}
		return elns;
	}